

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O1

void Hop_TableProfile(Hop_Man_t *p)

{
  Hop_Obj_t *pHVar1;
  int iVar2;
  long lVar3;
  
  if (0 < p->nTableSize) {
    lVar3 = 0;
    do {
      pHVar1 = p->pTable[lVar3];
      iVar2 = 0;
      if (pHVar1 != (Hop_Obj_t *)0x0) {
        iVar2 = 0;
        do {
          iVar2 = iVar2 + 1;
          pHVar1 = (pHVar1->field_1).pNext;
        } while (pHVar1 != (Hop_Obj_t *)0x0);
      }
      if (iVar2 != 0) {
        printf("%d ");
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nTableSize);
  }
  return;
}

Assistant:

void Hop_TableProfile( Hop_Man_t * p )
{
    Hop_Obj_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}